

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter::format
          (c_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  value_type *buf_ptr;
  scoped_pad p;
  format_int fStack_68;
  scoped_pad local_48;
  
  scoped_pad::scoped_pad(&local_48,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar6);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&dest->super_basic_buffer<char>,pcVar6,pcVar6 + sVar5);
  if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
  }
  sVar3 = (dest->super_basic_buffer<char>).size_;
  (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
  (dest->super_basic_buffer<char>).ptr_[sVar3] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar6);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&dest->super_basic_buffer<char>,pcVar6,pcVar6 + sVar5);
  if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
  }
  sVar3 = (dest->super_basic_buffer<char>).size_;
  (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
  (dest->super_basic_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar6 = fmt::v5::format_int::format_decimal(&fStack_68,(ulong)uVar4);
  fStack_68.str_ = pcVar6;
  if ((int)uVar1 < 0) {
    fStack_68.str_ = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  if (-0x16 < (long)&fStack_68 - (long)fStack_68.str_) {
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,fStack_68.str_,
               fStack_68.str_ + ((long)&fStack_68 - (long)fStack_68.str_) + 0x15);
    if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar3 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar3] = ' ';
    fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
    if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar3 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar3] = ':';
    fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
    if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar3 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar3] = ':';
    fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
    if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar3 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar3 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar3] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    pcVar6 = fmt::v5::format_int::format_decimal(&fStack_68,(ulong)uVar4);
    fStack_68.str_ = pcVar6;
    if (iVar2 < -0x76c) {
      fStack_68.str_ = pcVar6 + -1;
      pcVar6[-1] = '-';
    }
    if (-0x16 < (long)&fStack_68 - (long)fStack_68.str_) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,fStack_68.str_,
                 fStack_68.str_ + ((long)&fStack_68 - (long)fStack_68.str_) + 0x15);
      scoped_pad::~scoped_pad(&local_48);
      return;
    }
  }
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                ,0xde,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
               );
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 24;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[tm_time.tm_wday], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[tm_time.tm_mon], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }